

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O3

int Lf_ObjArrival_rec(Lf_Man_t *p,Gia_Obj_t *pDriver)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  uint uVar3;
  Lf_Bst_t *pLVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  
  uVar5 = *(ulong *)pDriver;
  uVar3 = (uint)(uVar5 >> 0x20);
  uVar6 = uVar3 & 0x1fffffff;
  bVar7 = (uVar5 & 0x80000000) == 0;
  if (((bVar7) && (uVar2 = (uint)uVar5 & 0x1fffffff, uVar2 != 0x1fffffff)) && (uVar2 == uVar6)) {
    do {
      pDriver = pDriver + -(ulong)((uint)uVar5 & 0x1fffffff);
      uVar5 = *(ulong *)pDriver;
      uVar3 = (uint)(uVar5 >> 0x20);
      uVar6 = uVar3 & 0x1fffffff;
      bVar7 = (uVar5 & 0x80000000) == 0;
      if ((!bVar7) || (uVar2 = (uint)uVar5 & 0x1fffffff, uVar2 == 0x1fffffff)) break;
    } while (uVar2 == uVar6);
  }
  if ((bool)(bVar7 ^ 1U | (~(uint)uVar5 & 0x1fffffff) == 0)) {
    if ((~(uint)uVar5 & 0x9fffffff) != 0) {
      return 0;
    }
    if (bVar7) {
      __assert_fail("pObj->fTerm",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
    }
    if ((p->vCiArrivals).nSize <= (int)uVar6) goto LAB_00764490;
    pLVar4 = (Lf_Bst_t *)((ulong)((uVar3 & 0x1fffffff) << 2) + (long)(p->vCiArrivals).pArray);
  }
  else {
    pGVar1 = p->pGia->pObjs;
    if ((pDriver < pGVar1) || (pGVar1 + p->pGia->nObjs <= pDriver)) {
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar3 = (int)((long)pDriver - (long)pGVar1 >> 2) * -0x55555555;
    if (((int)uVar3 < 0) || ((p->vOffsets).nSize <= (int)uVar3)) {
LAB_00764490:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    pLVar4 = p->pObjBests + (p->vOffsets).pArray[uVar3 & 0x7fffffff];
  }
  return pLVar4->Delay[0];
}

Assistant:

int Lf_ObjArrival_rec( Lf_Man_t * p, Gia_Obj_t * pDriver )
{
    if ( Gia_ObjIsBuf(pDriver) )
        return Lf_ObjArrival_rec( p, Gia_ObjFanin0(pDriver) );
    if ( Gia_ObjIsAnd(pDriver) )
        return Lf_ObjReadBest(p, Gia_ObjId(p->pGia, pDriver))->Delay[0];
    if ( Gia_ObjIsCi(pDriver) )
        return Lf_ObjCiArrival(p, Gia_ObjCioId(pDriver));
    return 0;
}